

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall GenericModelItem::insertRows(GenericModelItem *this,int row,int count)

{
  QVector<GenericModelItem_*> *this_00;
  ulong uVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  GenericModelItem *this_01;
  reference ppGVar5;
  GenericModelItem **ppGVar6;
  ulong i;
  
  if (0 < this->m_colCount) {
    this_00 = &this->children;
    iVar3 = QList<GenericModelItem_*>::begin(this_00);
    iVar2 = this->m_colCount;
    iVar4 = QList<GenericModelItem_*>::end(this_00);
    for (ppGVar6 = iVar3.i + (long)row * (long)iVar2; ppGVar6 != iVar4.i; ppGVar6 = ppGVar6 + 1) {
      (*ppGVar6)->m_row = (*ppGVar6)->m_row + count;
    }
    QList<GenericModelItem_*>::insert
              (this_00,(long)(this->m_colCount * row),(long)(this->m_colCount * count),
               (parameter_type)0x0);
    iVar2 = this->m_colCount;
    for (i = (ulong)(iVar2 * row); (long)i < (long)(iVar2 * (row + count)); i = i + 1) {
      this_01 = (GenericModelItem *)operator_new(0x58);
      GenericModelItem(this_01,this);
      iVar2 = this->m_colCount;
      uVar1 = (ulong)(uint)((int)i >> 0x1f) << 0x20 | i & 0xffffffff;
      this_01->m_column = (int)((long)uVar1 % (long)iVar2);
      this_01->m_row = (int)((long)uVar1 / (long)iVar2);
      ppGVar5 = QList<GenericModelItem_*>::operator[](this_00,i);
      *ppGVar5 = this_01;
      iVar2 = this->m_colCount;
    }
  }
  this->m_rowCount = this->m_rowCount + count;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, int count)
{
    if (m_colCount > 0) {
        for (auto i = children.begin() + (row * m_colCount), iEnd = children.end(); i != iEnd; ++i)
            (*i)->m_row += count;
        children.insert(row * m_colCount, count * m_colCount, nullptr);
        for (int i = row * m_colCount; i < (row + count) * m_colCount; ++i) {
            auto newChild = new GenericModelItem(this);
            newChild->m_column = i % m_colCount;
            newChild->m_row = i / m_colCount;
            children[i] = newChild;
        }
    }
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}